

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-xref.c
# Opt level: O0

void pdf_init_document(hd_context *ctx,pdf_document *doc)

{
  hd_document_count_pages_fn *phVar1;
  int *piVar2;
  pdf_document *ppVar3;
  int iVar4;
  int iVar5;
  pdf_obj *ppVar6;
  pdf_obj *ppVar7;
  pdf_xref_entry *ppVar8;
  pdf_obj *ppVar9;
  pdf_xref_entry *entry;
  int xref_len;
  int hasinfo;
  int hasroot;
  pdf_obj *nobj;
  pdf_obj *obj;
  pdf_obj *dict;
  int i;
  int repaired;
  pdf_document *doc_local;
  hd_context *ctx_local;
  
  dict._4_4_ = 0;
  obj = (pdf_obj *)0x0;
  _i = doc;
  doc_local = (pdf_document *)ctx;
  hd_var_imp(&obj);
  iVar4 = hd_push_try((hd_context *)doc_local);
  if ((iVar4 != 0) && (iVar4 = __sigsetjmp(*(long *)(doc_local->super).count_pages + 8), iVar4 == 0)
     ) {
    pdf_load_xref((hd_context *)doc_local,_i,&(_i->lexbuf).base);
  }
  phVar1 = (doc_local->super).count_pages;
  piVar2 = *(int **)phVar1;
  *(int **)phVar1 = piVar2 + -0x34;
  if (1 < *piVar2) {
    hd_rethrow_if((hd_context *)doc_local,4);
    hd_warn((hd_context *)doc_local,"trying to repair broken xref");
    dict._4_4_ = 1;
  }
  iVar4 = hd_push_try((hd_context *)doc_local);
  if (((iVar4 != 0) &&
      (iVar4 = __sigsetjmp(*(long *)(doc_local->super).count_pages + 8), iVar4 == 0)) &&
     (dict._4_4_ != 0)) {
    _hasinfo = (pdf_obj *)0x0;
    hd_var_imp(&hasinfo);
    memset(_i->xref_index,0,(long)_i->max_xref_len << 2);
    pdf_repair_xref((hd_context *)doc_local,_i);
    pdf_prime_xref_index((hd_context *)doc_local,_i);
    iVar4 = pdf_xref_len((hd_context *)doc_local,_i);
    pdf_repair_obj_stms((hd_context *)doc_local,_i);
    ppVar3 = doc_local;
    ppVar6 = pdf_trailer((hd_context *)doc_local,_i);
    ppVar6 = pdf_dict_get((hd_context *)ppVar3,ppVar6,(pdf_obj *)0x12d);
    ppVar3 = doc_local;
    ppVar7 = pdf_trailer((hd_context *)doc_local,_i);
    ppVar7 = pdf_dict_get((hd_context *)ppVar3,ppVar7,(pdf_obj *)0xc1);
    for (dict._0_4_ = 1; (int)(uint)dict < iVar4; dict._0_4_ = (uint)dict + 1) {
      ppVar8 = pdf_get_xref_entry((hd_context *)doc_local,_i,(uint)dict);
      if ((ppVar8->type != '\0') && (ppVar8->type != 'f')) {
        iVar5 = hd_push_try((hd_context *)doc_local);
        if ((iVar5 != 0) &&
           (iVar5 = __sigsetjmp(*(long *)(doc_local->super).count_pages + 8,0), iVar5 == 0)) {
          obj = pdf_load_object((hd_context *)doc_local,_i,(uint)dict);
        }
        phVar1 = (doc_local->super).count_pages;
        piVar2 = *(int **)phVar1;
        *(int **)phVar1 = piVar2 + -0x34;
        if (*piVar2 < 2) {
          if (ppVar6 == (pdf_obj *)0x0) {
            nobj = pdf_dict_get((hd_context *)doc_local,obj,(pdf_obj *)0x159);
            iVar5 = pdf_name_eq((hd_context *)doc_local,nobj,(pdf_obj *)0x46);
            if (iVar5 != 0) {
              _hasinfo = pdf_new_indirect((hd_context *)doc_local,_i,(uint)dict,0);
              ppVar3 = doc_local;
              ppVar9 = pdf_trailer((hd_context *)doc_local,_i);
              pdf_dict_put_drop((hd_context *)ppVar3,ppVar9,(pdf_obj *)0x12d,_hasinfo);
            }
          }
          if ((ppVar7 == (pdf_obj *)0x0) &&
             ((ppVar9 = pdf_dict_get((hd_context *)doc_local,obj,(pdf_obj *)0x55),
              ppVar9 != (pdf_obj *)0x0 ||
              (ppVar9 = pdf_dict_get((hd_context *)doc_local,obj,(pdf_obj *)0x11d),
              ppVar9 != (pdf_obj *)0x0)))) {
            _hasinfo = pdf_new_indirect((hd_context *)doc_local,_i,(uint)dict,0);
            ppVar3 = doc_local;
            ppVar9 = pdf_trailer((hd_context *)doc_local,_i);
            pdf_dict_put_drop((hd_context *)ppVar3,ppVar9,(pdf_obj *)0xc1,_hasinfo);
          }
          pdf_drop_obj((hd_context *)doc_local,obj);
          obj = (pdf_obj *)0x0;
        }
        else {
          hd_rethrow_if((hd_context *)doc_local,4);
          hd_warn((hd_context *)doc_local,"ignoring broken object (%d 0 R)",(ulong)(uint)dict);
        }
      }
    }
  }
  phVar1 = (doc_local->super).count_pages;
  piVar2 = *(int **)phVar1;
  *(int **)phVar1 = piVar2 + -0x34;
  if (*piVar2 < 2) {
    return;
  }
  if (obj != (pdf_obj *)0x0) {
    pdf_drop_obj((hd_context *)doc_local,obj);
  }
  hd_rethrow((hd_context *)doc_local);
}

Assistant:

static void
pdf_init_document(hd_context *ctx, pdf_document *doc)
{
	int repaired = 0;
    int i;

    pdf_obj *dict = NULL;
    hd_var(dict);

    hd_try(ctx)
    {
        pdf_load_xref(ctx, doc, &doc->lexbuf.base);
    }
    hd_catch(ctx)
    {
        hd_rethrow_if(ctx, HD_ERROR_TRYLATER);
        hd_warn(ctx, "trying to repair broken xref");
		repaired = 1;
    }

	hd_try(ctx)
	{
		if (repaired)
		{
            pdf_obj *obj;
            pdf_obj *nobj = NULL;
            hd_var(nobj);
			/*TODO:Some files are not at the bottom of the xref*/
			/* pdf_repair_xref may access xref_index, so reset it properly */
			memset(doc->xref_index, 0, sizeof(int) * doc->max_xref_len);
			pdf_repair_xref(ctx, doc);
            pdf_prime_xref_index(ctx, doc);


            int hasroot, hasinfo;

            int xref_len = pdf_xref_len(ctx, doc);
            pdf_repair_obj_stms(ctx, doc);

            hasroot = (pdf_dict_get(ctx, pdf_trailer(ctx, doc), PDF_NAME_Root) != NULL);
            hasinfo = (pdf_dict_get(ctx, pdf_trailer(ctx, doc), PDF_NAME_Info) != NULL);

            for (i = 1; i < xref_len; i++)
            {
                pdf_xref_entry *entry = pdf_get_xref_entry(ctx, doc, i);
                if (entry->type == 0 || entry->type == 'f')
                    continue;

                hd_try(ctx)
                {
                    dict = pdf_load_object(ctx, doc, i);
					/*if (dict == NULL)
						hd_throw(ctx, HD_ERROR_GENERIC, "ignoring broken object (%d 0 R)", i);*/
                }
                hd_catch(ctx)
                {
                    hd_rethrow_if(ctx, HD_ERROR_TRYLATER);
                    hd_warn(ctx, "ignoring broken object (%d 0 R)", i);
                    continue;
                }

                if (!hasroot)
                {

                    obj = pdf_dict_get(ctx, dict, PDF_NAME_Type);
                    if (pdf_name_eq(ctx, obj, PDF_NAME_Catalog))
                    {
                        nobj = pdf_new_indirect(ctx, doc, i, 0);
                        pdf_dict_put_drop(ctx, pdf_trailer(ctx, doc), PDF_NAME_Root, nobj);
                    }
                }

                if (!hasinfo)
                {
                    if (pdf_dict_get(ctx, dict, PDF_NAME_Creator) || pdf_dict_get(ctx, dict, PDF_NAME_Producer))
                    {
                        nobj = pdf_new_indirect(ctx, doc, i, 0);
                        pdf_dict_put_drop(ctx, pdf_trailer(ctx, doc), PDF_NAME_Info, nobj);
                    }
                }

                pdf_drop_obj(ctx, dict);
                dict = NULL;
            }

		}
	}
	hd_catch(ctx)
	{
        if (dict != NULL)
            pdf_drop_obj(ctx, dict);
        hd_rethrow(ctx);
	}
}